

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_trust_anchors_parse_serverhello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  size_t sVar4;
  Span<const_unsigned_char> SVar5;
  bssl *local_48;
  undefined1 local_38 [8];
  CBS child;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  if (contents == (CBS *)0x0) {
    hs_local._7_1_ = true;
  }
  else {
    child.len = (size_t)contents;
    uVar2 = ssl_protocol_version(hs->ssl);
    if (uVar2 < 0x304) {
      ERR_put_error(0x10,0,0xde,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xaa0);
      *out_alert = 'n';
      hs_local._7_1_ = false;
    }
    else {
      iVar3 = CBS_get_u16_length_prefixed((CBS *)child.len,(CBS *)local_38);
      if ((iVar3 != 0) && (sVar4 = CBS_len((CBS *)local_38), sVar4 != 0)) {
        SVar5 = cbs_st::operator_cast_to_Span((cbs_st *)local_38);
        local_48 = (bssl *)SVar5.data_;
        SVar5.data_ = SVar5.size_;
        bVar1 = ssl_is_valid_trust_anchor_list(local_48,SVar5);
        if (bVar1) {
          SVar5 = cbs_st::operator_cast_to_Span((cbs_st *)local_38);
          bVar1 = Array<unsigned_char>::CopyFrom(&hs->peer_available_trust_anchors,SVar5);
          if (!bVar1) {
            *out_alert = 'P';
            return false;
          }
          return true;
        }
      }
      *out_alert = '2';
      ERR_put_error(0x10,0,0x89,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xaab);
      hs_local._7_1_ = false;
    }
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_trust_anchors_parse_serverhello(SSL_HANDSHAKE *hs,
                                                uint8_t *out_alert,
                                                CBS *contents) {
  if (contents == nullptr) {
    return true;
  }

  if (ssl_protocol_version(hs->ssl) < TLS1_3_VERSION) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_EXTENSION);
    *out_alert = SSL_AD_UNSUPPORTED_EXTENSION;
    return false;
  }

  CBS child;
  if (!CBS_get_u16_length_prefixed(contents, &child) ||
      // The list of available trust anchors may not be empty.
      CBS_len(&child) == 0 ||  //
      !ssl_is_valid_trust_anchor_list(child)) {
    *out_alert = SSL_AD_DECODE_ERROR;
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }

  if (!hs->peer_available_trust_anchors.CopyFrom(child)) {
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return false;
  }
  return true;
}